

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

string * cmCTestTestHandler::FindExecutable
                   (string *__return_storage_ptr__,cmCTest *ctest,char *testCommand,
                   string *resultingConfig,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *extraPaths,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *failed)

{
  bool bVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attempted;
  string fullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attemptedConfigs;
  string filepath;
  string filename;
  char *local_248 [4];
  string tempPath;
  string local_208;
  string local_1e8;
  string localfilepath;
  string local_50;
  
  attempted.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attemptedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attempted.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attempted.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attemptedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attemptedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tempPath._M_dataplus._M_p = (pointer)&tempPath.field_2;
  tempPath._M_string_length = 0;
  tempPath.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&localfilepath,testCommand,(allocator *)&filename);
  cmsys::SystemTools::GetFilenamePath(&filepath,&localfilepath);
  std::__cxx11::string::~string((string *)&localfilepath);
  std::__cxx11::string::string((string *)&localfilepath,testCommand,(allocator *)&fullPath);
  cmsys::SystemTools::GetFilenameName(&filename,&localfilepath);
  std::__cxx11::string::~string((string *)&localfilepath);
  std::__cxx11::string::string((string *)&local_1e8,(string *)&filepath);
  AddConfigurations(ctest,&attempted,&attemptedConfigs,&local_1e8,&filename);
  std::__cxx11::string::~string((string *)&local_1e8);
  if (filepath._M_string_length == 0) {
LAB_00328351:
    uVar3 = 0;
    while( true ) {
      uVar4 = (ulong)uVar3;
      pbVar5 = (extraPaths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(extraPaths->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5) <= uVar4)
      break;
      cmsys::SystemTools::GetFilenamePath(&localfilepath,pbVar5 + uVar4);
      cmsys::SystemTools::GetFilenameName
                (&fullPath,
                 (extraPaths->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar4);
      std::__cxx11::string::string((string *)&local_50,(string *)&localfilepath);
      AddConfigurations(ctest,&attempted,&attemptedConfigs,&local_50,&fullPath);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&fullPath);
      std::__cxx11::string::~string((string *)&localfilepath);
      uVar3 = uVar3 + 1;
    }
  }
  else if (*filepath._M_dataplus._M_p == '/') {
    std::__cxx11::string::substr((ulong)&localfilepath,(ulong)&filepath);
    std::__cxx11::string::string((string *)&local_208,(string *)&localfilepath);
    AddConfigurations(ctest,&attempted,&attemptedConfigs,&local_208,&filename);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&localfilepath);
    if (filepath._M_string_length == 0) goto LAB_00328351;
  }
  fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
  fullPath._M_string_length = 0;
  fullPath.field_2._M_local_buf[0] = '\0';
  for (uVar3 = 0; uVar4 = (ulong)uVar3,
      uVar4 < (ulong)((long)attempted.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)attempted.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    if (fullPath._M_string_length != 0) goto LAB_00328321;
    bVar1 = cmsys::SystemTools::FileExists
                      (attempted.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p);
    if ((!bVar1) ||
       (bVar1 = cmsys::SystemTools::FileIsDirectory
                          (attempted.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar4), bVar1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(failed,attempted.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar4);
      std::__cxx11::string::_M_assign((string *)&tempPath);
      cmsys::SystemTools::GetExecutableExtension();
      std::__cxx11::string::append((char *)&tempPath);
      bVar1 = cmsys::SystemTools::FileExists(tempPath._M_dataplus._M_p);
      if ((bVar1) && (bVar1 = cmsys::SystemTools::FileIsDirectory(&tempPath), !bVar1)) {
        cmsys::SystemTools::CollapseFullPath(&localfilepath,&tempPath);
        goto LAB_003282eb;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(failed,&tempPath);
    }
    else {
      cmsys::SystemTools::CollapseFullPath
                (&localfilepath,
                 attempted.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar4);
LAB_003282eb:
      std::__cxx11::string::operator=((string *)&fullPath,(string *)&localfilepath);
      std::__cxx11::string::~string((string *)&localfilepath);
      std::__cxx11::string::_M_assign((string *)resultingConfig);
    }
  }
  if (fullPath._M_string_length == 0) {
    if (filepath._M_string_length == 0) {
      localfilepath._M_dataplus._M_p = (pointer)0x0;
      localfilepath._M_string_length = 0;
      localfilepath.field_2._M_allocated_capacity = 0;
      cmsys::SystemTools::FindProgram
                (__return_storage_ptr__,filename._M_dataplus._M_p,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&localfilepath,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&localfilepath);
      bVar1 = std::operator!=(__return_storage_ptr__,"");
      if (bVar1) {
        std::__cxx11::string::assign((char *)resultingConfig);
        goto LAB_00328405;
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      if (fullPath._M_string_length != 0) goto LAB_00328321;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&localfilepath);
    poVar2 = std::operator<<((ostream *)&localfilepath,"Could not find executable ");
    poVar2 = std::operator<<(poVar2,testCommand);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Looked in the following places:\n");
    std::__cxx11::stringbuf::str();
    cmCTest::Log(ctest,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x6bc,local_248[0],false);
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&localfilepath);
    for (pbVar5 = (failed->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != (failed->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&localfilepath);
      poVar2 = std::operator<<((ostream *)&localfilepath,(string *)pbVar5);
      std::operator<<(poVar2,"\n");
      std::__cxx11::stringbuf::str();
      cmCTest::Log(ctest,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x6bf,local_248[0],false);
      std::__cxx11::string::~string((string *)local_248);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&localfilepath);
    }
  }
LAB_00328321:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fullPath._M_dataplus._M_p == &fullPath.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(fullPath.field_2._M_allocated_capacity._1_7_,fullPath.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = fullPath.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = fullPath._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(fullPath.field_2._M_allocated_capacity._1_7_,fullPath.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = fullPath._M_string_length;
  fullPath._M_string_length = 0;
  fullPath.field_2._M_local_buf[0] = '\0';
  fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
LAB_00328405:
  std::__cxx11::string::~string((string *)&fullPath);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&filepath);
  std::__cxx11::string::~string((string *)&tempPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&attemptedConfigs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&attempted);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestTestHandler::FindExecutable(
  cmCTest* ctest, const char* testCommand, std::string& resultingConfig,
  std::vector<std::string>& extraPaths, std::vector<std::string>& failed)
{
  // now run the compiled test if we can find it
  std::vector<std::string> attempted;
  std::vector<std::string> attemptedConfigs;
  std::string tempPath;
  std::string filepath = cmSystemTools::GetFilenamePath(testCommand);
  std::string filename = cmSystemTools::GetFilenameName(testCommand);

  cmCTestTestHandler::AddConfigurations(ctest, attempted, attemptedConfigs,
                                        filepath, filename);

  // even if a fullpath was specified also try it relative to the current
  // directory
  if (!filepath.empty() && filepath[0] == '/') {
    std::string localfilepath = filepath.substr(1, filepath.size() - 1);
    cmCTestTestHandler::AddConfigurations(ctest, attempted, attemptedConfigs,
                                          localfilepath, filename);
  }

  // if extraPaths are provided and we were not passed a full path, try them,
  // try any extra paths
  if (filepath.empty()) {
    for (unsigned int i = 0; i < extraPaths.size(); ++i) {
      std::string filepathExtra =
        cmSystemTools::GetFilenamePath(extraPaths[i]);
      std::string filenameExtra =
        cmSystemTools::GetFilenameName(extraPaths[i]);
      cmCTestTestHandler::AddConfigurations(ctest, attempted, attemptedConfigs,
                                            filepathExtra, filenameExtra);
    }
  }

  // store the final location in fullPath
  std::string fullPath;

  // now look in the paths we specified above
  for (unsigned int ai = 0; ai < attempted.size() && fullPath.empty(); ++ai) {
    // first check without exe extension
    if (cmSystemTools::FileExists(attempted[ai].c_str()) &&
        !cmSystemTools::FileIsDirectory(attempted[ai])) {
      fullPath = cmSystemTools::CollapseFullPath(attempted[ai]);
      resultingConfig = attemptedConfigs[ai];
    }
    // then try with the exe extension
    else {
      failed.push_back(attempted[ai]);
      tempPath = attempted[ai];
      tempPath += cmSystemTools::GetExecutableExtension();
      if (cmSystemTools::FileExists(tempPath.c_str()) &&
          !cmSystemTools::FileIsDirectory(tempPath)) {
        fullPath = cmSystemTools::CollapseFullPath(tempPath);
        resultingConfig = attemptedConfigs[ai];
      } else {
        failed.push_back(tempPath);
      }
    }
  }

  // if everything else failed, check the users path, but only if a full path
  // wasn't specified
  if (fullPath.empty() && filepath.empty()) {
    std::string path = cmSystemTools::FindProgram(filename.c_str());
    if (path != "") {
      resultingConfig = "";
      return path;
    }
  }
  if (fullPath.empty()) {
    cmCTestLog(ctest, HANDLER_OUTPUT, "Could not find executable "
                 << testCommand << "\n"
                 << "Looked in the following places:\n");
    for (std::vector<std::string>::iterator i = failed.begin();
         i != failed.end(); ++i) {
      cmCTestLog(ctest, HANDLER_OUTPUT, *i << "\n");
    }
  }

  return fullPath;
}